

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereTerm *
sqlite3WhereFindTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  ulong in_RCX;
  ushort in_R8W;
  WhereScan scan;
  WhereTerm *p;
  WhereTerm *pResult;
  Index *in_stack_ffffffffffffff48;
  u32 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  WhereClause *in_stack_ffffffffffffff60;
  WhereScan *in_stack_ffffffffffffff68;
  WhereScan *in_stack_ffffffffffffff78;
  WhereTerm *local_40;
  WhereTerm *local_38;
  
  local_38 = (WhereTerm *)0x0;
  local_40 = whereScanInit(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
  do {
    if (local_40 == (WhereTerm *)0x0) {
      return local_38;
    }
    if ((local_40->prereqRight & in_RCX) == 0) {
      if ((local_40->prereqRight == 0) && ((local_40->eOperator & in_R8W & 0x82) != 0)) {
        return local_40;
      }
      if (local_38 == (WhereTerm *)0x0) {
        local_38 = local_40;
      }
    }
    local_40 = whereScanNext(in_stack_ffffffffffffff78);
  } while( true );
}

Assistant:

SQLITE_PRIVATE WhereTerm *sqlite3WhereFindTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pResult = 0;
  WhereTerm *p;
  WhereScan scan;

  p = whereScanInit(&scan, pWC, iCur, iColumn, op, pIdx);
  op &= WO_EQ|WO_IS;
  while( p ){
    if( (p->prereqRight & notReady)==0 ){
      if( p->prereqRight==0 && (p->eOperator&op)!=0 ){
        testcase( p->eOperator & WO_IS );
        return p;
      }
      if( pResult==0 ) pResult = p;
    }
    p = whereScanNext(&scan);
  }
  return pResult;
}